

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::StoreComponentOfValueTo
          (InterfaceVariableScalarReplacement *this,uint32_t component_type_id,uint32_t value_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *component_indices,Instruction *ptr,
          uint32_t *extra_array_index,Instruction *insert_before)

{
  Instruction *this_00;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_01;
  DefUseManager *this_02;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_a4;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_a0;
  InterfaceVariableScalarReplacement *local_98;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_90;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_98 = this;
  this_00 = CreateCompositeExtract
                      (this,component_type_id,value_id,component_indices,extra_array_index);
  local_a0._M_head_impl = this_00;
  this_01.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )::operator_new(0x70);
  Instruction::Instruction
            ((Instruction *)
             this_01.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
             (this->super_Pass).context_,OpStore);
  local_90._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       this_01.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_a4 = Instruction::result_id(ptr);
  init_list._M_len = 1;
  init_list._M_array = &local_a4;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_88.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>
            ((OperandList *)
             ((long)this_01.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 0x38)
             ,&local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  local_a4 = Instruction::result_id(this_00);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_a4;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
  local_88.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>
            ((OperandList *)
             ((long)this_01.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 0x38)
             ,&local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  this_02 = IRContext::get_def_use_mgr((local_98->super_Pass).context_);
  analysis::DefUseManager::AnalyzeInstDefUse(this_02,this_00);
  analysis::DefUseManager::AnalyzeInstDefUse
            (this_02,(Instruction *)
                     this_01.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  Instruction::InsertBefore
            (insert_before,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_a0);
  Instruction::InsertBefore
            (insert_before,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_90);
  if ((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       )local_90._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
      (Instruction *)0x0) {
    (**(code **)(*(long *)local_90._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                8))();
  }
  if (local_a0._M_head_impl != (Instruction *)0x0) {
    (*((local_a0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::StoreComponentOfValueTo(
    uint32_t component_type_id, uint32_t value_id,
    const std::vector<uint32_t>& component_indices, Instruction* ptr,
    const uint32_t* extra_array_index, Instruction* insert_before) {
  std::unique_ptr<Instruction> composite_extract(CreateCompositeExtract(
      component_type_id, value_id, component_indices, extra_array_index));

  std::unique_ptr<Instruction> new_store(
      new Instruction(context(), spv::Op::OpStore));
  new_store->AddOperand({SPV_OPERAND_TYPE_ID, {ptr->result_id()}});
  new_store->AddOperand(
      {SPV_OPERAND_TYPE_ID, {composite_extract->result_id()}});

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  def_use_mgr->AnalyzeInstDefUse(composite_extract.get());
  def_use_mgr->AnalyzeInstDefUse(new_store.get());

  insert_before->InsertBefore(std::move(composite_extract));
  insert_before->InsertBefore(std::move(new_store));
}